

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O3

void __thiscall streams_tests::streams_buffered_file::test_method(streams_buffered_file *this)

{
  long lVar1;
  FILE *__stream;
  int iVar2;
  size_t in_RCX;
  size_t sVar3;
  ulong uVar4;
  char cVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  _func_int **pp_Var8;
  long in_FS_OFFSET;
  bool bVar9;
  readonly_property<bool> rVar10;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  check_type cVar11;
  char *local_7b0;
  char *local_7a8;
  undefined1 *local_7a0;
  undefined1 *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  undefined1 *local_5e0;
  undefined1 *local_5d8;
  char *local_5d0;
  char *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 local_2ac [4];
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  undefined1 local_268 [16];
  undefined1 *local_258;
  char *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char *local_238;
  char *local_230;
  uint8_t i;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  BufferedFile bfbad;
  AutoFile local_150;
  uint8_t obj_4;
  _func_int *local_128;
  _func_int **local_120;
  char *local_118;
  assertion_result local_110;
  uint8_t obj_9;
  undefined1 local_f0 [8];
  assertion_result local_e8;
  _func_int **local_d0;
  uint8_t obj;
  bool local_c0;
  undefined1 *local_b8;
  lazy_ostream *local_b0;
  uint8_t a [29];
  path local_88;
  path streams_test_filename;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDir
            ((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args,false);
  std::filesystem::__cxx11::path::_M_append(&local_88,0x10,"streams_test_tmp");
  std::filesystem::__cxx11::path::path(&streams_test_filename.super_path,&local_88);
  std::filesystem::__cxx11::path::~path(&local_88);
  local_150.m_file = (FILE *)fsbridge::fopen((char *)&streams_test_filename.super_path,"w+b");
  local_150.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_150.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar5 = '\0';
  do {
    bfbad.m_src = (AutoFile *)CONCAT71(bfbad.m_src._1_7_,cVar5);
    AutoFile::write(&local_150,(int)&bfbad,(void *)0x1,in_RCX);
    cVar5 = cVar5 + '\x01';
  } while (cVar5 != '(');
  rewind((FILE *)local_150.m_file);
  BufferedFile::BufferedFile(&bfbad,&local_150,0x19,0x19);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x644bce;
  file.m_end = (iterator)0x10e;
  file.m_begin = (iterator)&local_1a0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b0,msg);
  local_e8._0_8_ = local_e8._0_8_ & 0xffffffffffffff00;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0 = (lazy_ostream *)local_268;
  local_268._0_8_ = "false";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1b8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_1c0,0x10e);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  if (bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  bfbad.nSrcPos = 0;
  bfbad.m_read_pos = 0;
  bfbad.nReadLimit = 0xffffffffffffffff;
  bfbad.nRewind = 10;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bfbad.m_src = &local_150;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x19);
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish =
       bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start + 0x19;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[9] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[10] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x10] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x11] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x12] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x13] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x14] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x15] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x16] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x17] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0x18] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[2] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[3] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[4] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[5] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[6] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[7] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[8] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[9] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[10] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xe] = 0;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start[0xf] = 0;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x644d30;
  file_00.m_end = (iterator)0x116;
  file_00.m_begin = (iterator)&local_200;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_finish;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_210,
             msg_00);
  rVar10.super_class_property<bool>.value = (class_property<bool>)true;
  if (bfbad.m_read_pos == bfbad.nSrcPos) {
    _cVar11 = 0x644d54;
    iVar2 = feof((FILE *)(bfbad.m_src)->m_file);
    rVar10.super_class_property<bool>.value = (class_property<bool>)(iVar2 == 0);
  }
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar10.super_class_property<bool>.value;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0 = (lazy_ostream *)local_268;
  local_268._0_8_ = "!bf.eof()";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_218 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  sVar3 = 0x116;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_220,0x116);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_230 = "";
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x11a;
  file_01.m_begin = (iterator)&local_238;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_248,
             msg_01);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_f0 = (undefined1  [8])&local_128;
  local_120 = (_func_int **)&i;
  a[0] = i == '\0';
  local_128._0_4_ = 0;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_b0 = (lazy_ostream *)&local_120;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013aee50;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  sVar3 = 0x11a;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xeb3827,(size_t)&local_110
             ,0x11a,&obj,"0",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x11c;
  file_02.m_begin = (iterator)&local_278;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_288,
             msg_02);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  a[0] = i == '\x01';
  local_128 = (_func_int *)CONCAT44(local_128._4_4_,1);
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = (_func_int **)&i;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013aee50;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])&local_128;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xeb3827,(size_t)&local_110
             ,0x11c,&obj,"1",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_298 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_290 = "";
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x11f;
  file_03.m_begin = (iterator)&local_298;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2a8,
             msg_03);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_128 = (_func_int *)bfbad.m_read_pos;
  local_f0 = (undefined1  [8])local_2ac;
  local_2ac = (undefined1  [4])0x2;
  a[0] = bfbad.m_read_pos == 2;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = &local_128;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae0c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xf466bc,(size_t)&local_110
             ,0x11f,&obj,"2U",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x6452a2;
  file_04.m_end = (iterator)0x122;
  file_04.m_begin = (iterator)&local_2c0;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2d0,
             msg_04);
  uVar4 = (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  bfbad.m_read_pos = 0;
  if (bfbad.nSrcPos >= uVar4) {
    bfbad.m_read_pos = bfbad.nSrcPos - uVar4;
  }
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(bfbad.nSrcPos < uVar4 || bfbad.nSrcPos - uVar4 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "bf.SetPos(0)";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2d8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  sVar3 = 0x122;
  local_b0 = (lazy_ostream *)local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_2e0,0x122);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x124;
  file_05.m_begin = (iterator)&local_2f0;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_300,
             msg_05);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  a[0] = i == '\0';
  local_128 = (_func_int *)((ulong)local_128 & 0xffffffff00000000);
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = (_func_int **)&i;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013aee50;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])&local_128;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xeb3827,(size_t)&local_110
             ,0x124,&obj,"0",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_308 = "";
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x645530;
  file_06.m_end = (iterator)0x127;
  file_06.m_begin = (iterator)&local_310;
  msg_06.m_end = pvVar7;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_320,
             msg_06);
  bfbad.m_read_pos = 2;
  if (1 >= bfbad.nSrcPos) {
    bfbad.m_read_pos = bfbad.nSrcPos;
  }
  bVar9 = bfbad.nSrcPos <=
          ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 2U;
  if (!bVar9) {
    bfbad.m_read_pos =
         bfbad.nSrcPos -
         ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bVar9 && 1 < bfbad.nSrcPos);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "bf.SetPos(2)";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_328 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  sVar3 = 0x127;
  local_b0 = (lazy_ostream *)local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_330,0x127);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x129;
  file_07.m_begin = (iterator)&local_340;
  msg_07.m_end = pvVar7;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_350,
             msg_07);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  a[0] = i == '\x02';
  local_128 = (_func_int *)CONCAT44(local_128._4_4_,2);
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = (_func_int **)&i;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013aee50;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])&local_128;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xeb3827,(size_t)&local_110
             ,0x129,&obj,"2",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x6457d6;
  file_08.m_end = (iterator)0x12f;
  file_08.m_begin = (iterator)&local_360;
  msg_08.m_end = pvVar7;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_370,
             msg_08);
  if (bfbad.m_read_pos < 4) {
    bfbad.nReadLimit = 3;
  }
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "bf.SetLimit(3)";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_378 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  sVar3 = 0x12f;
  local_b0 = (lazy_ostream *)local_268;
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bfbad.m_read_pos < 4);
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_380,0x12f);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  BufferedFile::read(&bfbad,(int)&obj_4,(void *)0x1,sVar3);
  i = obj_4;
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x6458f7;
  file_09.m_end = (iterator)0x132;
  file_09.m_begin = (iterator)&local_390;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3a0,
             msg_09);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "false";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_3a8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_b0 = (lazy_ostream *)local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_3b0,0x132);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x6459c4;
  file_10.m_end = (iterator)0x138;
  file_10.m_begin = (iterator)&local_3f0;
  msg_10.m_end = pvVar7;
  msg_10.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_400,
             msg_10);
  bfbad.nReadLimit = 0xffffffffffffffff;
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x1;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "bf.SetLimit()";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_408 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_b0 = (lazy_ostream *)local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_410,0x138);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x13a;
  file_11.m_begin = (iterator)&local_420;
  msg_11.m_end = pvVar7;
  msg_11.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_430,
             msg_11);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_128 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 3;
  local_2ac = (undefined1  [4])0x3;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = &local_128;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae0c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])local_2ac;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  sVar3 = 0x13a;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xf466bc,(size_t)&local_110
             ,0x13a,&obj,"3U",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_128._0_1_ = 3;
  do {
    BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
    i = obj;
    local_440 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_438 = "";
    local_450 = &boost::unit_test::basic_cstring<char_const>::null;
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x13f;
    file_12.m_begin = (iterator)&local_440;
    msg_12.m_end = pvVar7;
    msg_12.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_450,
               msg_12);
    local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
    local_268._0_8_ = &PTR__lazy_ostream_013ae088;
    local_258 = boost::unit_test::lazy_ostream::inst;
    local_250 = "";
    a[0] = i == (byte)local_128;
    a[8] = '\0';
    a[9] = '\0';
    a[10] = '\0';
    a[0xb] = '\0';
    a[0xc] = '\0';
    a[0xd] = '\0';
    a[0xe] = '\0';
    a[0xf] = '\0';
    a[0x10] = '\0';
    a[0x11] = '\0';
    a[0x12] = '\0';
    a[0x13] = '\0';
    a[0x14] = '\0';
    a[0x15] = '\0';
    a[0x16] = '\0';
    a[0x17] = '\0';
    local_110._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_110.m_message.px = (element_type *)0xf45e79;
    local_120 = (_func_int **)&i;
    local_c0 = false;
    _obj = &PTR__lazy_ostream_013aee50;
    local_b8 = boost::unit_test::lazy_ostream::inst;
    local_b0 = (lazy_ostream *)&local_120;
    local_f0 = (undefined1  [8])&local_128;
    local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
    local_e8._0_8_ = &PTR__lazy_ostream_013aee50;
    local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_d0 = (_func_int **)local_f0;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    sVar3 = 0x13f;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xeb3827,
               (size_t)&local_110,0x13f,&obj,"j",&local_e8);
    boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
    local_128._0_1_ = (byte)local_128 + 1;
  } while ((byte)local_128 < 10);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x141;
  file_13.m_begin = (iterator)&local_460;
  msg_13.m_end = pvVar7;
  msg_13.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_470,
             msg_13);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_128 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 10;
  local_2ac = (undefined1  [4])0xa;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = &local_128;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae0c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])local_2ac;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xf466bc,(size_t)&local_110
             ,0x141,&obj,"10U",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x645f86;
  file_14.m_end = (iterator)0x144;
  file_14.m_begin = (iterator)&local_480;
  msg_14.m_end = pvVar7;
  msg_14.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_490,
             msg_14);
  uVar4 = (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  bfbad.m_read_pos = 0;
  if (bfbad.nSrcPos >= uVar4) {
    bfbad.m_read_pos = bfbad.nSrcPos - uVar4;
  }
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(bfbad.nSrcPos < uVar4 || bfbad.nSrcPos - uVar4 == 0);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "bf.SetPos(0)";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_498 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_b0 = (lazy_ostream *)local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_4a0,0x144);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x145;
  file_15.m_begin = (iterator)&local_4b0;
  msg_15.m_end = pvVar7;
  msg_15.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_4c0,
             msg_15);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_128 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 0;
  local_2ac = (undefined1  [4])0x0;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = &local_128;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae0c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])local_2ac;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  sVar3 = 0x145;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xf466bc,(size_t)&local_110
             ,0x145,(lazy_ostream *)&obj,"0U",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x147;
  file_16.m_begin = (iterator)&local_4d0;
  msg_16.m_end = pvVar7;
  msg_16.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4e0,
             msg_16);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  a[0] = i == '\0';
  local_128 = (_func_int *)((ulong)local_128 & 0xffffffff00000000);
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = (_func_int **)&i;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013aee50;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])&local_128;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xeb3827,(size_t)&local_110
             ,0x147,&obj,"0",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_4e8 = "";
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x646377;
  file_17.m_end = (iterator)0x14c;
  file_17.m_begin = (iterator)&local_4f0;
  msg_17.m_end = pvVar7;
  msg_17.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_500,
             msg_17);
  bfbad.m_read_pos = 10;
  if (9 >= bfbad.nSrcPos) {
    bfbad.m_read_pos = bfbad.nSrcPos;
  }
  bVar9 = bfbad.nSrcPos <=
          ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 10U;
  if (!bVar9) {
    bfbad.m_read_pos =
         bfbad.nSrcPos -
         ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bVar9 && 9 < bfbad.nSrcPos);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "bf.SetPos(10)";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_510 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_508 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  sVar3 = 0x14c;
  local_b0 = (lazy_ostream *)local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_510,0x14c);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x14e;
  file_18.m_begin = (iterator)&local_520;
  msg_18.m_end = pvVar7;
  msg_18.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_530,
             msg_18);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  a[0] = i == '\n';
  local_128 = (_func_int *)CONCAT44(local_128._4_4_,10);
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = (_func_int **)&i;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013aee50;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])&local_128;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xeb3827,(size_t)&local_110
             ,0x14e,&obj,"10",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x14f;
  file_19.m_begin = (iterator)&local_540;
  msg_19.m_end = pvVar7;
  msg_19.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_550,
             msg_19);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_128 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 0xb;
  local_2ac = (undefined1  [4])0xb;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = &local_128;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae0c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])local_2ac;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xf466bc,(size_t)&local_110
             ,0x14f,&obj,"11U",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x646789;
  file_20.m_end = (iterator)0x153;
  file_20.m_begin = (iterator)&local_560;
  msg_20.m_end = pvVar7;
  msg_20.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_570,
             msg_20);
  uVar4 = ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 1;
  bfbad.m_read_pos = (ulong)(bfbad.nSrcPos != 0);
  if (uVar4 < bfbad.nSrcPos) {
    bfbad.m_read_pos =
         bfbad.nSrcPos -
         ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bfbad.nSrcPos - 1 < uVar4);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "bf.SetPos(1)";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_578 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_b0 = (lazy_ostream *)local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_580,0x153);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x154;
  file_21.m_begin = (iterator)&local_590;
  msg_21.m_end = pvVar7;
  msg_21.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_5a0,
             msg_21);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_128 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 1;
  local_2ac = (undefined1  [4])0x1;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = &local_128;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae0c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])local_2ac;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  sVar3 = 0x154;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xf466bc,(size_t)&local_110
             ,0x154,(lazy_ostream *)&obj,"1U",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_5a8 = "";
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x156;
  file_22.m_begin = (iterator)&local_5b0;
  msg_22.m_end = pvVar7;
  msg_22.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_5c0,
             msg_22);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  a[0] = i == '\x01';
  local_128 = (_func_int *)CONCAT44(local_128._4_4_,1);
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = (_func_int **)&i;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013aee50;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])&local_128;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xeb3827,(size_t)&local_110
             ,0x156,&obj,"1",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_5d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_5c8 = "";
  local_5e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5d8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x646b92;
  file_23.m_end = (iterator)0x15a;
  file_23.m_begin = (iterator)&local_5d0;
  msg_23.m_end = pvVar7;
  msg_23.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_5e0,
             msg_23);
  bfbad.m_read_pos = 0xb;
  if (10 >= bfbad.nSrcPos) {
    bfbad.m_read_pos = bfbad.nSrcPos;
  }
  bVar9 = bfbad.nSrcPos <=
          ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 0xbU;
  if (!bVar9) {
    bfbad.m_read_pos =
         bfbad.nSrcPos -
         ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bVar9 && 10 < bfbad.nSrcPos);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "bf.SetPos(11)";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_5e8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  sVar3 = 0x15a;
  local_b0 = (lazy_ostream *)local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_5f0,0x15a);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  pp_Var8 = (_func_int **)a;
  BufferedFile::read(&bfbad,(int)pp_Var8,(void *)0x1d,sVar3);
  uVar4 = 0xb;
  do {
    local_600 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_5f8 = "";
    local_610 = &boost::unit_test::basic_cstring<char_const>::null;
    local_608 = &boost::unit_test::basic_cstring<char_const>::null;
    file_24.m_end = (iterator)0x15f;
    file_24.m_begin = (iterator)&local_600;
    msg_24.m_end = pvVar7;
    msg_24.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_610,
               msg_24);
    local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
    local_268._0_8_ = &PTR__lazy_ostream_013ae088;
    local_258 = boost::unit_test::lazy_ostream::inst;
    local_250 = "";
    local_2ac = SUB84(uVar4,0);
    local_110.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(uVar4 == *(byte *)pp_Var8);
    local_110.m_message.px = (element_type *)0x0;
    local_110.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_120 = (_func_int **)0xf45e1a;
    local_118 = "";
    local_c0 = false;
    _obj = &PTR__lazy_ostream_013aee50;
    local_b8 = boost::unit_test::lazy_ostream::inst;
    local_b0 = (lazy_ostream *)local_f0;
    local_128 = (_func_int *)local_2ac;
    local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
    local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
    local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_d0 = &local_128;
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x2;
    local_f0 = (undefined1  [8])pp_Var8;
    boost::test_tools::tt_detail::report_assertion
              (&local_110,(lazy_ostream *)local_268,1,2,REQUIRE,0xf46786,(size_t)&local_120,0x15f,
               &obj,"11 + j",&local_e8);
    boost::detail::shared_count::~shared_count(&local_110.m_message.pn);
    pp_Var8 = (_func_int **)((long)pp_Var8 + 1);
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x28);
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x162;
  file_25.m_begin = (iterator)&local_620;
  msg_25.m_end = pvVar7;
  msg_25.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_630,
             msg_25);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_128 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 0x28;
  local_2ac = (undefined1  [4])0x28;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = &local_128;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae0c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])local_2ac;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  sVar3 = 0x162;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xf466bc,(size_t)&local_110
             ,0x162,&obj,"40U",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  BufferedFile::read(&bfbad,(int)&obj_9,(void *)0x1,sVar3);
  i = obj_9;
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x647036;
  file_26.m_end = (iterator)0x167;
  file_26.m_begin = (iterator)&local_640;
  msg_26.m_end = pvVar7;
  msg_26.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_650,
             msg_26);
  local_e8._0_8_ = local_e8._0_8_ & 0xffffffffffffff00;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "false";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_658 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_b0 = (lazy_ostream *)local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_660,0x167);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x64710a;
  file_27.m_end = (iterator)0x16d;
  file_27.m_begin = (iterator)&local_6a0;
  msg_27.m_end = pvVar7;
  msg_27.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_6b0,
             msg_27);
  if (bfbad.m_read_pos == bfbad.nSrcPos) {
    _cVar11 = 0x64712c;
    iVar2 = feof((FILE *)(bfbad.m_src)->m_file);
    rVar10.super_class_property<bool>.value = (class_property<bool>)(iVar2 != 0);
  }
  else {
    rVar10.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar10.super_class_property<bool>.value;
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "bf.eof()";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_6b8 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_b0 = (lazy_ostream *)local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_6c0,0x16d);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_6c8 = "";
  local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x170;
  file_28.m_begin = (iterator)&local_6d0;
  msg_28.m_end = pvVar7;
  msg_28.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_6e0,
             msg_28);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_128 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 0x28;
  local_2ac = (undefined1  [4])0x28;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = &local_128;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae0c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])local_2ac;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xf466bc,(size_t)&local_110
             ,0x170,(lazy_ostream *)&obj,"40U",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_6f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x647374;
  file_29.m_end = (iterator)0x171;
  file_29.m_begin = (iterator)&local_6f0;
  msg_29.m_end = pvVar7;
  msg_29.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_700,
             msg_29);
  bfbad.m_read_pos = 0x1e;
  if (0x1d >= bfbad.nSrcPos) {
    bfbad.m_read_pos = bfbad.nSrcPos;
  }
  bVar9 = bfbad.nSrcPos <=
          ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 0x1eU;
  if (!bVar9) {
    bfbad.m_read_pos =
         bfbad.nSrcPos -
         ((long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bVar9 && 0x1d < bfbad.nSrcPos);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "bf.SetPos(30)";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_710 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_708 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  sVar3 = 0x171;
  local_b0 = (lazy_ostream *)local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_710,0x171);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  BufferedFile::read(&bfbad,(int)&obj,(void *)0x1,sVar3);
  i = obj;
  local_720 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x173;
  file_30.m_begin = (iterator)&local_720;
  msg_30.m_end = pvVar7;
  msg_30.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_730,
             msg_30);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  a[0] = i == '\x1e';
  local_128 = (_func_int *)CONCAT44(local_128._4_4_,0x1e);
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = (_func_int **)&i;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013aee50;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])&local_128;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae248;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xeb3827,(size_t)&local_110
             ,0x173,&obj,"30",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_740 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_738 = "";
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x174;
  file_31.m_begin = (iterator)&local_740;
  msg_31.m_end = pvVar7;
  msg_31.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_750,
             msg_31);
  local_268._8_8_ = local_268._8_8_ & 0xffffffffffffff00;
  local_268._0_8_ = &PTR__lazy_ostream_013ae088;
  local_258 = boost::unit_test::lazy_ostream::inst;
  local_250 = "";
  local_128 = (_func_int *)bfbad.m_read_pos;
  a[0] = bfbad.m_read_pos == 0x1f;
  local_2ac = (undefined1  [4])0x1f;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_110._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
  ;
  local_110.m_message.px = (element_type *)0xf45e79;
  local_120 = &local_128;
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae0c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = (lazy_ostream *)&local_120;
  local_f0 = (undefined1  [8])local_2ac;
  local_e8.m_message.px = (element_type *)((ulong)local_e8.m_message.px & 0xffffffffffffff00);
  local_e8._0_8_ = &PTR__lazy_ostream_013ae108;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d0 = (_func_int **)local_f0;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_268,1,2,REQUIRE,0xf466bc,(size_t)&local_110
             ,0x174,&obj,"31U",&local_e8);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_758 = "";
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x647777;
  file_32.m_end = (iterator)0x177;
  file_32.m_begin = (iterator)&local_760;
  msg_32.m_end = pvVar7;
  msg_32.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_770,
             msg_32);
  uVar4 = (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  bfbad.m_read_pos = 0;
  if (uVar4 <= bfbad.nSrcPos) {
    bfbad.m_read_pos = bfbad.nSrcPos - uVar4;
  }
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "!bf.SetPos(0)";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_780 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_778 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_b0 = (lazy_ostream *)local_268;
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)(uVar4 <= bfbad.nSrcPos && bfbad.nSrcPos - uVar4 != 0);
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_780,0x177);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  local_790 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_788 = "";
  local_7a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_798 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x647860;
  file_33.m_end = (iterator)0x17a;
  file_33.m_begin = (iterator)&local_790;
  msg_33.m_end = pvVar7;
  msg_33.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_7a0,
             msg_33);
  local_e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(bfbad.m_read_pos < 0x1f);
  local_e8.m_message.px = (element_type *)0x0;
  local_e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_268._0_8_ = "bf.GetPos() <= 30U";
  local_268._8_8_ = "";
  local_c0 = false;
  _obj = &PTR__lazy_ostream_013ae1c8;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_7b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_7a8 = "";
  local_b0 = (lazy_ostream *)local_268;
  boost::test_tools::tt_detail::report_assertion
            (&local_e8,(lazy_ostream *)&obj,1,0,WARN,_cVar11,(size_t)&local_7b0,0x17a);
  boost::detail::shared_count::~shared_count(&local_e8.m_message.pn);
  __stream = local_150.m_file;
  local_150.m_file = (FILE *)0x0;
  if ((FILE *)__stream != (FILE *)0x0) {
    fclose((FILE *)__stream);
  }
  std::filesystem::remove((path *)&streams_test_filename);
  if (bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)bfbad.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  AutoFile::~AutoFile(&local_150);
  std::filesystem::__cxx11::path::~path(&streams_test_filename.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_buffered_file)
{
    fs::path streams_test_filename = m_args.GetDataDirBase() / "streams_test_tmp";
    AutoFile file{fsbridge::fopen(streams_test_filename, "w+b")};

    // The value at each offset is the offset.
    for (uint8_t j = 0; j < 40; ++j) {
        file << j;
    }
    std::rewind(file.Get());

    // The buffer size (second arg) must be greater than the rewind
    // amount (third arg).
    try {
        BufferedFile bfbad{file, 25, 25};
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                        "Rewind limit must be less than buffer size") != nullptr);
    }

    // The buffer is 25 bytes, allow rewinding 10 bytes.
    BufferedFile bf{file, 25, 10};
    BOOST_CHECK(!bf.eof());

    uint8_t i;
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 1);

    // After reading bytes 0 and 1, we're positioned at 2.
    BOOST_CHECK_EQUAL(bf.GetPos(), 2U);

    // Rewind to offset 0, ok (within the 10 byte window).
    BOOST_CHECK(bf.SetPos(0));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);

    // We can go forward to where we've been, but beyond may fail.
    BOOST_CHECK(bf.SetPos(2));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 2);

    // If you know the maximum number of bytes that should be
    // read to deserialize the variable, you can limit the read
    // extent. The current file offset is 3, so the following
    // SetLimit() allows zero bytes to be read.
    BOOST_CHECK(bf.SetLimit(3));
    try {
        bf >> i;
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                           "Attempt to position past buffer limit") != nullptr);
    }
    // The default argument removes the limit completely.
    BOOST_CHECK(bf.SetLimit());
    // The read position should still be at 3 (no change).
    BOOST_CHECK_EQUAL(bf.GetPos(), 3U);

    // Read from current offset, 3, forward until position 10.
    for (uint8_t j = 3; j < 10; ++j) {
        bf >> i;
        BOOST_CHECK_EQUAL(i, j);
    }
    BOOST_CHECK_EQUAL(bf.GetPos(), 10U);

    // We're guaranteed (just barely) to be able to rewind to zero.
    BOOST_CHECK(bf.SetPos(0));
    BOOST_CHECK_EQUAL(bf.GetPos(), 0U);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);

    // We can set the position forward again up to the farthest
    // into the stream we've been, but no farther. (Attempting
    // to go farther may succeed, but it's not guaranteed.)
    BOOST_CHECK(bf.SetPos(10));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 10);
    BOOST_CHECK_EQUAL(bf.GetPos(), 11U);

    // Now it's only guaranteed that we can rewind to offset 1
    // (current read position, 11, minus rewind amount, 10).
    BOOST_CHECK(bf.SetPos(1));
    BOOST_CHECK_EQUAL(bf.GetPos(), 1U);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 1);

    // We can stream into large variables, even larger than
    // the buffer size.
    BOOST_CHECK(bf.SetPos(11));
    {
        uint8_t a[40 - 11];
        bf >> a;
        for (uint8_t j = 0; j < sizeof(a); ++j) {
            BOOST_CHECK_EQUAL(a[j], 11 + j);
        }
    }
    BOOST_CHECK_EQUAL(bf.GetPos(), 40U);

    // We've read the entire file, the next read should throw.
    try {
        bf >> i;
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                        "BufferedFile::Fill: end of file") != nullptr);
    }
    // Attempting to read beyond the end sets the EOF indicator.
    BOOST_CHECK(bf.eof());

    // Still at offset 40, we can go back 10, to 30.
    BOOST_CHECK_EQUAL(bf.GetPos(), 40U);
    BOOST_CHECK(bf.SetPos(30));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 30);
    BOOST_CHECK_EQUAL(bf.GetPos(), 31U);

    // We're too far to rewind to position zero.
    BOOST_CHECK(!bf.SetPos(0));
    // But we should now be positioned at least as far back as allowed
    // by the rewind window (relative to our farthest read position, 40).
    BOOST_CHECK(bf.GetPos() <= 30U);

    // We can explicitly close the file, or the destructor will do it.
    file.fclose();

    fs::remove(streams_test_filename);
}